

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O1

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::performSolutionPolishing
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  cpp_dec_float<100U,_int,_void> *pcVar1;
  uint *puVar2;
  byte bVar3;
  uint n;
  uint n_00;
  fpclass_type fVar4;
  SPxOut *pSVar5;
  long *plVar6;
  pointer pnVar7;
  char cVar8;
  undefined8 uVar9;
  int32_t iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  bool bVar14;
  bool bVar15;
  Status SVar16;
  int iVar17;
  int iVar18;
  cpp_dec_float<100U,_int,_void> *pcVar19;
  Item *in_RCX;
  long lVar20;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *pCVar21;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar22;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *pCVar23;
  long lVar24;
  int i;
  Real RVar25;
  SPxId polishId;
  DIdxSet slackcandidates;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  DIdxSet continuousvars;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  origval;
  char local_7d1;
  DataKey local_7d0;
  DIdxSet local_7c8;
  cpp_dec_float<100U,_int,_void> local_7a8;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_758;
  Status *local_750;
  Status *local_748;
  int local_73c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_738;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6e8;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  fpclass_type local_658;
  byte local_654;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_650;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_648;
  undefined8 uStack_640;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_638;
  undefined8 uStack_630;
  undefined1 local_628 [16];
  undefined1 local_618 [16];
  undefined1 local_608 [16];
  uint local_5f8 [3];
  undefined3 uStack_5eb;
  fpclass_type fStack_5e8;
  bool bStack_5e4;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_5e0;
  undefined1 local_5d8 [16];
  undefined1 local_5c8 [16];
  undefined1 local_5b8 [16];
  uint local_5a8 [3];
  undefined3 uStack_59b;
  fpclass_type fStack_598;
  bool bStack_594;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_590;
  DIdxSet local_588;
  uint local_568 [18];
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_520;
  ulong local_518;
  undefined8 uStack_510;
  uint local_508 [2];
  uint auStack_500 [2];
  uint local_4f8 [2];
  uint auStack_4f0 [2];
  uint local_4e8 [2];
  uint auStack_4e0 [2];
  uint local_4d8 [2];
  undefined8 uStack_4d0;
  uint local_4c8 [2];
  uint auStack_4c0 [2];
  uint local_4b8 [2];
  uint auStack_4b0 [2];
  uint local_4a8 [2];
  uint auStack_4a0 [2];
  uint local_498 [2];
  undefined8 uStack_490;
  uint local_488 [2];
  uint auStack_480 [2];
  uint local_478 [2];
  uint auStack_470 [2];
  uint local_468 [2];
  uint auStack_460 [2];
  uint local_458 [2];
  undefined8 uStack_450;
  cpp_dec_float<100U,_int,_void> local_448;
  cpp_dec_float<100U,_int,_void> local_3f8;
  cpp_dec_float<100U,_int,_void> local_3a8;
  cpp_dec_float<100U,_int,_void> local_358;
  cpp_dec_float<100U,_int,_void> local_308;
  cpp_dec_float<100U,_int,_void> local_2b8;
  cpp_dec_float<100U,_int,_void> local_260;
  cpp_dec_float<100U,_int,_void> local_210;
  cpp_dec_float<100U,_int,_void> local_1c0;
  cpp_dec_float<100U,_int,_void> local_170;
  cpp_dec_float<100U,_int,_void> local_120;
  uint local_d0 [2];
  uint auStack_c8 [2];
  uint local_c0 [2];
  uint auStack_b8 [2];
  uint local_b0 [2];
  uint auStack_a8 [2];
  uint local_a0 [2];
  uint auStack_98 [2];
  int local_90;
  undefined1 local_8c;
  fpclass_type local_88;
  int32_t iStack_84;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined4 local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar14 = false;
  if ((-1 < this->maxIters) &&
     (this->maxIters <=
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).iterCount)) {
    bVar14 = isTimeLimitReached(this,false);
    bVar14 = !bVar14;
  }
  if (((bVar14) || (this->polishObj == POLISH_OFF)) || (SVar16 = status(this), SVar16 != OPTIMAL)) {
    bVar14 = false;
  }
  else {
    local_750 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data;
    local_748 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data;
    local_7d0.info = 0;
    local_7d0.idx = -1;
    local_568[0xc] = 0;
    local_568[0xd] = 0;
    local_568[0xe] = 0;
    local_568[0xf] = 0;
    local_568[8] = 0;
    local_568[9] = 0;
    local_568[10] = 0;
    local_568[0xb] = 0;
    local_568[4] = 0;
    local_568[5] = 0;
    local_568[6] = 0;
    local_568[7] = 0;
    local_568[0] = 0;
    local_568[1] = 0;
    local_568[2] = 0;
    local_568[3] = 0;
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x5e])(local_d0,this);
    pSVar5 = this->spxout;
    if ((pSVar5 != (SPxOut *)0x0) && (3 < (int)pSVar5->m_verbosity)) {
      local_7a8.data._M_elems[0] = pSVar5->m_verbosity;
      local_738.m_backend.data._M_elems[0] = 4;
      (*pSVar5->_vptr_SPxOut[2])();
      pSVar5 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar5->m_streams[pSVar5->m_verbosity]," --- perform solution polishing",0x1f);
      in_RCX = (Item *)pSVar5->m_streams;
      plVar6 = *(long **)((((cpp_dec_float<100U,_int,_void> *)&in_RCX->data)->data)._M_elems +
                         (ulong)pSVar5->m_verbosity * 2);
      cVar8 = (char)plVar6;
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + cVar8);
      std::ostream::put(cVar8);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_7a8);
    }
    if (this->theRep == COLUMN) {
      setType(this,ENTER);
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x76])(this);
      entertol((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_7a8,this);
      local_7d1 = local_7a8.neg;
      iVar17 = local_7a8.exp;
      local_568[0xc] = local_7a8.data._M_elems[0xc];
      local_568[0xd] = local_7a8.data._M_elems[0xd];
      local_568[0xe] = local_7a8.data._M_elems[0xe];
      local_568[0xf] = local_7a8.data._M_elems[0xf];
      local_568[8] = local_7a8.data._M_elems[8];
      local_568[9] = local_7a8.data._M_elems[9];
      local_568[10] = local_7a8.data._M_elems[10];
      local_568[0xb] = local_7a8.data._M_elems[0xb];
      local_568[4] = local_7a8.data._M_elems[4];
      local_568[5] = local_7a8.data._M_elems[5];
      local_568[6] = local_7a8.data._M_elems[6];
      local_568[7] = local_7a8.data._M_elems[7];
      local_568[0] = local_7a8.data._M_elems[0];
      local_568[1] = local_7a8.data._M_elems[1];
      local_568[2] = local_7a8.data._M_elems[2];
      local_568[3] = local_7a8.data._M_elems[3];
      local_518._0_4_ = local_7a8.fpclass;
      local_518._4_4_ = local_7a8.prec_elem;
      uStack_510 = 0;
      this->instableEnter = false;
      (*this->theratiotester->_vptr_SPxRatioTester[9])
                (this->theratiotester,(ulong)(uint)this->theType);
      local_73c = iVar17;
      if (this->polishObj == POLISH_INTEGRALITY) {
        n = (this->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum;
        pCVar21 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                   *)(ulong)n;
        n_00 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
        DIdxSet::DIdxSet(&local_7c8,n);
        local_648 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     *)(ulong)n_00;
        DIdxSet::DIdxSet(&local_588,n_00);
        if (0 < (int)n) {
          lVar24 = 0x48;
          pCVar23 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     *)0x0;
          local_758 = pCVar21;
          do {
            if ((local_750[(long)pCVar23] | D_ON_UPPER) == P_ON_UPPER) {
              pnVar7 = (this->theCoPvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar2 = (uint *)((long)(pnVar7->m_backend).data._M_elems + lVar24 + -0x48);
              local_488 = *(uint (*) [2])puVar2;
              auStack_480 = *(uint (*) [2])(puVar2 + 2);
              puVar2 = (uint *)((long)(pnVar7->m_backend).data._M_elems + lVar24 + -0x38);
              local_478 = *(uint (*) [2])puVar2;
              auStack_470 = *(uint (*) [2])(puVar2 + 2);
              puVar2 = (uint *)((long)(pnVar7->m_backend).data._M_elems + lVar24 + -0x28);
              local_468 = *(uint (*) [2])puVar2;
              auStack_460 = *(uint (*) [2])(puVar2 + 2);
              puVar2 = (uint *)((long)(pnVar7->m_backend).data._M_elems + lVar24 + -0x18);
              local_458 = *(uint (*) [2])puVar2;
              uStack_450 = *(undefined8 *)(puVar2 + 2);
              fVar4 = *(fpclass_type *)((long)(pnVar7->m_backend).data._M_elems + lVar24 + -8);
              bVar3 = *(byte *)((long)(pnVar7->m_backend).data._M_elems + lVar24 + -4);
              local_638 = *(ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                            **)((long)(pnVar7->m_backend).data._M_elems + lVar24);
              uStack_630 = 0;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
              cpp_dec_float<long_long>(&local_120,0,(type *)0x0);
              RVar25 = Tolerances::epsilon((this->
                                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           )._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr);
              local_2b8.fpclass = cpp_dec_float_finite;
              local_2b8.prec_elem = 0x10;
              local_2b8.data._M_elems[0] = 0;
              local_2b8.data._M_elems[1] = 0;
              local_2b8.data._M_elems[2] = 0;
              local_2b8.data._M_elems[3] = 0;
              local_2b8.data._M_elems[4] = 0;
              local_2b8.data._M_elems[5] = 0;
              local_2b8.data._M_elems[6] = 0;
              local_2b8.data._M_elems[7] = 0;
              local_2b8.data._M_elems[8] = 0;
              local_2b8.data._M_elems[9] = 0;
              local_2b8.data._M_elems[10] = 0;
              local_2b8.data._M_elems[0xb] = 0;
              local_2b8.data._M_elems[0xc] = 0;
              local_2b8.data._M_elems[0xd] = 0;
              local_2b8.data._M_elems._56_5_ = 0;
              local_2b8.data._M_elems[0xf]._1_3_ = 0;
              local_2b8.exp = 0;
              local_2b8.neg = false;
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)&local_2b8,RVar25);
              local_698._0_4_ = local_488[0];
              local_698._4_4_ = local_488[1];
              uStack_690._0_4_ = auStack_480[0];
              uStack_690._4_4_ = auStack_480[1];
              local_688._0_4_ = local_478[0];
              local_688._4_4_ = local_478[1];
              uStack_680._0_4_ = auStack_470[0];
              uStack_680._4_4_ = auStack_470[1];
              local_678._0_4_ = local_468[0];
              local_678._4_4_ = local_468[1];
              uStack_670._0_4_ = auStack_460[0];
              uStack_670._4_4_ = auStack_460[1];
              local_668._0_4_ = local_458[0];
              local_668._4_4_ = local_458[1];
              uStack_660 = uStack_450;
              local_650 = local_638;
              local_6e8.m_backend.data._M_elems[0] = local_120.data._M_elems[0];
              local_6e8.m_backend.data._M_elems[1] = local_120.data._M_elems[1];
              local_6e8.m_backend.data._M_elems[2] = local_120.data._M_elems[2];
              local_6e8.m_backend.data._M_elems[3] = local_120.data._M_elems[3];
              local_6e8.m_backend.data._M_elems[4] = local_120.data._M_elems[4];
              local_6e8.m_backend.data._M_elems[5] = local_120.data._M_elems[5];
              local_6e8.m_backend.data._M_elems[6] = local_120.data._M_elems[6];
              local_6e8.m_backend.data._M_elems[7] = local_120.data._M_elems[7];
              local_6e8.m_backend.data._M_elems[8] = local_120.data._M_elems[8];
              local_6e8.m_backend.data._M_elems[9] = local_120.data._M_elems[9];
              local_6e8.m_backend.data._M_elems[10] = local_120.data._M_elems[10];
              local_6e8.m_backend.data._M_elems[0xb] = local_120.data._M_elems[0xb];
              local_6e8.m_backend.data._M_elems[0xc] = local_120.data._M_elems[0xc];
              local_6e8.m_backend.data._M_elems[0xd] = local_120.data._M_elems[0xd];
              local_6e8.m_backend.data._M_elems[0xe] = local_120.data._M_elems[0xe];
              local_6e8.m_backend.data._M_elems[0xf] = local_120.data._M_elems[0xf];
              local_6e8.m_backend.exp = local_120.exp;
              local_6e8.m_backend.neg = local_120.neg;
              local_6e8.m_backend.fpclass = local_120.fpclass;
              local_6e8.m_backend.prec_elem = local_120.prec_elem;
              local_658 = fVar4;
              local_654 = bVar3;
              relDiff<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                        (&local_738,(soplex *)&local_698,&local_6e8,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_RCX);
              local_7a8.data._M_elems[1] = local_738.m_backend.data._M_elems[1];
              local_7a8.data._M_elems[0] = local_738.m_backend.data._M_elems[0];
              local_7a8.data._M_elems[0xc] = local_738.m_backend.data._M_elems[0xc];
              local_7a8.data._M_elems[0xd] = local_738.m_backend.data._M_elems[0xd];
              local_7a8.data._M_elems[0xe] = local_738.m_backend.data._M_elems[0xe];
              local_7a8.data._M_elems[0xf] = local_738.m_backend.data._M_elems[0xf];
              local_7a8.data._M_elems[8] = local_738.m_backend.data._M_elems[8];
              local_7a8.data._M_elems[9] = local_738.m_backend.data._M_elems[9];
              local_7a8.data._M_elems[10] = local_738.m_backend.data._M_elems[10];
              local_7a8.data._M_elems[0xb] = local_738.m_backend.data._M_elems[0xb];
              local_7a8.data._M_elems[2] = local_738.m_backend.data._M_elems[2];
              local_7a8.data._M_elems[3] = local_738.m_backend.data._M_elems[3];
              local_7a8.exp = local_738.m_backend.exp;
              local_7a8.neg = local_738.m_backend.neg;
              local_7a8.fpclass = local_738.m_backend.fpclass;
              local_7a8.prec_elem = local_738.m_backend.prec_elem;
              in_RCX = (Item *)(local_738.m_backend._72_8_ & 0xffffffff);
              if ((local_738.m_backend.neg == true) &&
                 (local_738.m_backend.data._M_elems[0] != 0 || local_738.m_backend.fpclass != 0)) {
                local_7a8.neg = false;
              }
              pCVar21 = local_758;
              if (((local_738.m_backend.fpclass != 2) && (local_2b8.fpclass != cpp_dec_float_NaN))
                 && (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                              compare(&local_7a8,&local_2b8), pCVar21 = local_758, iVar17 < 1)) {
                DIdxSet::addIdx(&local_7c8,(int)pCVar23);
              }
            }
            pCVar23 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                       *)((long)&pCVar23->theitem + 1);
            lVar24 = lVar24 + 0x50;
          } while (pCVar21 != pCVar23);
        }
        in_RCX = (Item *)((ulong)local_648 & 0xffffffffffffff00);
        if (0 < (int)local_648 && (this->integerVariables).thesize == (int)local_648) {
          lVar24 = 0x48;
          pCVar21 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     *)0x0;
          do {
            if ((local_748[(long)pCVar21] | D_ON_UPPER) == P_ON_UPPER) {
              pnVar22 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .object.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pcVar19 = (cpp_dec_float<100U,_int,_void> *)
                        ((long)(pnVar22->m_backend).data._M_elems + lVar24 + -0x48);
              pcVar1 = (cpp_dec_float<100U,_int,_void> *)
                       ((long)(((this->thePvec->
                                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                       + lVar24 + -0x48);
              local_590 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                           *)0x1000000000;
              local_5d8 = (undefined1  [16])0x0;
              local_5c8 = (undefined1  [16])0x0;
              local_5b8 = (undefined1  [16])0x0;
              local_5a8[0] = 0;
              local_5a8[1] = 0;
              stack0xfffffffffffffa60 = 0;
              uStack_59b = 0;
              fStack_598 = cpp_dec_float_finite;
              bStack_594 = false;
              if (pcVar1 == (cpp_dec_float<100U,_int,_void> *)local_5d8) {
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          ((cpp_dec_float<100U,_int,_void> *)local_5d8,pcVar19);
                if (local_5d8._0_4_ != 0 || (fpclass_type)local_590 != cpp_dec_float_finite) {
                  bStack_594 = (bool)(bStack_594 ^ 1);
                }
              }
              else {
                if (pcVar19 != (cpp_dec_float<100U,_int,_void> *)local_5d8) {
                  local_5d8 = *(undefined1 (*) [16])(pcVar19->data)._M_elems;
                  local_5c8 = *(undefined1 (*) [16])
                               ((long)(pnVar22->m_backend).data._M_elems + lVar24 + -0x38);
                  local_5b8 = *(undefined1 (*) [16])
                               ((long)(pnVar22->m_backend).data._M_elems + lVar24 + -0x28);
                  local_5a8._0_8_ =
                       *(undefined8 *)((long)(pnVar22->m_backend).data._M_elems + lVar24 + -0x18);
                  uVar9 = *(undefined8 *)((long)(pnVar22->m_backend).data._M_elems + lVar24 + -0x10)
                  ;
                  stack0xfffffffffffffa60 = (undefined5)uVar9;
                  uStack_59b = (undefined3)((ulong)uVar9 >> 0x28);
                  fStack_598 = *(fpclass_type *)
                                ((long)(pnVar22->m_backend).data._M_elems + lVar24 + -8);
                  bStack_594 = *(bool *)((long)(pnVar22->m_backend).data._M_elems + lVar24 + -4);
                  local_590 = *(ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                                **)((long)(pnVar22->m_backend).data._M_elems + lVar24);
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          ((cpp_dec_float<100U,_int,_void> *)local_5d8,pcVar1);
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
              cpp_dec_float<long_long>(&local_170,0,(type *)0x0);
              RVar25 = Tolerances::epsilon((this->
                                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           )._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr);
              local_308.fpclass = cpp_dec_float_finite;
              local_308.prec_elem = 0x10;
              local_308.data._M_elems[0] = 0;
              local_308.data._M_elems[1] = 0;
              local_308.data._M_elems[2] = 0;
              local_308.data._M_elems[3] = 0;
              local_308.data._M_elems[4] = 0;
              local_308.data._M_elems[5] = 0;
              local_308.data._M_elems[6] = 0;
              local_308.data._M_elems[7] = 0;
              local_308.data._M_elems[8] = 0;
              local_308.data._M_elems[9] = 0;
              local_308.data._M_elems[10] = 0;
              local_308.data._M_elems[0xb] = 0;
              local_308.data._M_elems[0xc] = 0;
              local_308.data._M_elems[0xd] = 0;
              local_308.data._M_elems._56_5_ = 0;
              local_308.data._M_elems[0xf]._1_3_ = 0;
              local_308.exp = 0;
              local_308.neg = false;
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)&local_308,RVar25);
              auVar13 = local_5b8;
              auVar12 = local_5c8;
              auVar11 = local_5d8;
              uStack_660 = CONCAT35(uStack_59b,stack0xfffffffffffffa60);
              local_698._0_4_ = local_5d8._0_4_;
              local_698._4_4_ = local_5d8._4_4_;
              uStack_690._0_4_ = local_5d8._8_4_;
              uStack_690._4_4_ = local_5d8._12_4_;
              local_688._0_4_ = local_5c8._0_4_;
              local_688._4_4_ = local_5c8._4_4_;
              uStack_680._0_4_ = local_5c8._8_4_;
              uStack_680._4_4_ = local_5c8._12_4_;
              local_678._0_4_ = local_5b8._0_4_;
              local_678._4_4_ = local_5b8._4_4_;
              uStack_670._0_4_ = local_5b8._8_4_;
              uStack_670._4_4_ = local_5b8._12_4_;
              local_668._0_4_ = local_5a8[0];
              local_668._4_4_ = local_5a8[1];
              local_658 = fStack_598;
              local_654 = bStack_594;
              local_650 = local_590;
              local_6e8.m_backend.data._M_elems[0] = local_170.data._M_elems[0];
              local_6e8.m_backend.data._M_elems[1] = local_170.data._M_elems[1];
              local_6e8.m_backend.data._M_elems[2] = local_170.data._M_elems[2];
              local_6e8.m_backend.data._M_elems[3] = local_170.data._M_elems[3];
              local_6e8.m_backend.data._M_elems[4] = local_170.data._M_elems[4];
              local_6e8.m_backend.data._M_elems[5] = local_170.data._M_elems[5];
              local_6e8.m_backend.data._M_elems[6] = local_170.data._M_elems[6];
              local_6e8.m_backend.data._M_elems[7] = local_170.data._M_elems[7];
              local_6e8.m_backend.data._M_elems[8] = local_170.data._M_elems[8];
              local_6e8.m_backend.data._M_elems[9] = local_170.data._M_elems[9];
              local_6e8.m_backend.data._M_elems[10] = local_170.data._M_elems[10];
              local_6e8.m_backend.data._M_elems[0xb] = local_170.data._M_elems[0xb];
              local_6e8.m_backend.data._M_elems[0xc] = local_170.data._M_elems[0xc];
              local_6e8.m_backend.data._M_elems[0xd] = local_170.data._M_elems[0xd];
              local_6e8.m_backend.data._M_elems[0xe] = local_170.data._M_elems[0xe];
              local_6e8.m_backend.data._M_elems[0xf] = local_170.data._M_elems[0xf];
              local_6e8.m_backend.exp = local_170.exp;
              local_6e8.m_backend.neg = local_170.neg;
              local_6e8.m_backend.fpclass = local_170.fpclass;
              local_6e8.m_backend.prec_elem = local_170.prec_elem;
              local_5d8 = auVar11;
              local_5c8 = auVar12;
              local_5b8 = auVar13;
              relDiff<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                        (&local_738,(soplex *)&local_698,&local_6e8,pnVar22);
              local_7a8.data._M_elems[1] = local_738.m_backend.data._M_elems[1];
              local_7a8.data._M_elems[0] = local_738.m_backend.data._M_elems[0];
              local_7a8.data._M_elems[0xc] = local_738.m_backend.data._M_elems[0xc];
              local_7a8.data._M_elems[0xd] = local_738.m_backend.data._M_elems[0xd];
              local_7a8.data._M_elems[0xe] = local_738.m_backend.data._M_elems[0xe];
              local_7a8.data._M_elems[0xf] = local_738.m_backend.data._M_elems[0xf];
              local_7a8.data._M_elems[8] = local_738.m_backend.data._M_elems[8];
              local_7a8.data._M_elems[9] = local_738.m_backend.data._M_elems[9];
              local_7a8.data._M_elems[10] = local_738.m_backend.data._M_elems[10];
              local_7a8.data._M_elems[0xb] = local_738.m_backend.data._M_elems[0xb];
              local_7a8.data._M_elems[2] = local_738.m_backend.data._M_elems[2];
              local_7a8.data._M_elems[3] = local_738.m_backend.data._M_elems[3];
              local_7a8.exp = local_738.m_backend.exp;
              local_7a8.neg = local_738.m_backend.neg;
              local_7a8.fpclass = local_738.m_backend.fpclass;
              local_7a8.prec_elem = local_738.m_backend.prec_elem;
              in_RCX = (Item *)(local_738.m_backend._72_8_ & 0xffffffff);
              if ((local_738.m_backend.neg == true) &&
                 (local_738.m_backend.data._M_elems[0] != 0 || local_738.m_backend.fpclass != 0)) {
                local_7a8.neg = false;
              }
              if (((local_738.m_backend.fpclass != 2) && (local_308.fpclass != cpp_dec_float_NaN))
                 && ((iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                               compare(&local_7a8,&local_308), iVar17 < 1 &&
                     ((this->integerVariables).data[(long)pCVar21] == 0)))) {
                DIdxSet::addIdx(&local_588,(int)pCVar21);
              }
            }
            pCVar21 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                       *)((long)&pCVar21->theitem + 1);
            lVar24 = lVar24 + 0x50;
          } while (local_648 != pCVar21);
        }
        do {
          lVar24 = (long)local_7c8.super_IdxSet.num;
          if ((lVar24 < 1) || (bVar14)) {
            iVar17 = 0;
          }
          else {
            iVar17 = 0;
            do {
              local_7d0 = (DataKey)coId(this,local_7c8.super_IdxSet.idx[lVar24 + -1]);
              bVar15 = enter(this,(SPxId *)&local_7d0,true);
              (*(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x88])(this);
              if (bVar15) {
                iVar17 = iVar17 + 1;
                lVar20 = (long)local_7c8.super_IdxSet.num;
                local_7c8.super_IdxSet.num = local_7c8.super_IdxSet.num + -1;
                in_RCX = (Item *)(ulong)(uint)local_7c8.super_IdxSet.idx[lVar20 + -1];
                local_7c8.super_IdxSet.idx[lVar24 + -1] = local_7c8.super_IdxSet.idx[lVar20 + -1];
                if ((-1 < this->maxIters) &&
                   (this->maxIters <=
                    (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).iterCount)) {
                  bVar14 = true;
                }
              }
              bVar15 = isTimeLimitReached(this,false);
              if (bVar15) {
                bVar14 = true;
              }
            } while ((1 < lVar24) && (lVar24 = lVar24 + -1, !bVar14));
          }
          lVar24 = (long)local_588.super_IdxSet.num;
          if (0 < lVar24) {
            while (!bVar14) {
              local_7d0 = (DataKey)id(this,local_588.super_IdxSet.idx[lVar24 + -1]);
              bVar15 = enter(this,(SPxId *)&local_7d0,true);
              (*(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x88])(this);
              if (bVar15) {
                iVar17 = iVar17 + 1;
                lVar20 = (long)local_588.super_IdxSet.num;
                local_588.super_IdxSet.num = local_588.super_IdxSet.num + -1;
                in_RCX = (Item *)(ulong)(uint)local_588.super_IdxSet.idx[lVar20 + -1];
                local_588.super_IdxSet.idx[lVar24 + -1] = local_588.super_IdxSet.idx[lVar20 + -1];
                if ((-1 < this->maxIters) &&
                   (this->maxIters <=
                    (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).iterCount)) {
                  bVar14 = true;
                }
              }
              bVar15 = isTimeLimitReached(this,false);
              if (bVar15) {
                bVar14 = true;
              }
              if (lVar24 < 2) break;
              lVar24 = lVar24 + -1;
            }
          }
          if (iVar17 == 0) {
            bVar14 = true;
          }
          this->polishCount = this->polishCount + iVar17;
        } while (!bVar14);
        DIdxSet::~DIdxSet(&local_588);
      }
      else {
        DIdxSet::DIdxSet(&local_7c8,(this->thecovectors->set).thenum);
        if (0 < (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum) {
          lVar24 = 0;
          lVar20 = 0;
          do {
            if ((local_748[lVar20] | D_ON_UPPER) == P_ON_UPPER) {
              pnVar22 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .object.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pcVar1 = (cpp_dec_float<100U,_int,_void> *)
                       ((long)(pnVar22->m_backend).data._M_elems + lVar24);
              pcVar19 = (cpp_dec_float<100U,_int,_void> *)
                        ((long)(((this->thePvec->
                                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                               _M_elems + lVar24);
              local_5e0 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                           *)0x1000000000;
              local_628 = (undefined1  [16])0x0;
              local_618 = (undefined1  [16])0x0;
              local_608 = (undefined1  [16])0x0;
              local_5f8[0] = 0;
              local_5f8[1] = 0;
              stack0xfffffffffffffa10 = 0;
              uStack_5eb = 0;
              fStack_5e8 = cpp_dec_float_finite;
              bStack_5e4 = false;
              if (pcVar19 == (cpp_dec_float<100U,_int,_void> *)local_628) {
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          ((cpp_dec_float<100U,_int,_void> *)local_628,pcVar1);
                if (local_628._0_4_ != 0 || (fpclass_type)local_5e0 != cpp_dec_float_finite) {
                  bStack_5e4 = (bool)(bStack_5e4 ^ 1);
                }
              }
              else {
                if (pcVar1 != (cpp_dec_float<100U,_int,_void> *)local_628) {
                  local_628 = *(undefined1 (*) [16])(pcVar1->data)._M_elems;
                  local_618 = *(undefined1 (*) [16])((pcVar1->data)._M_elems + 4);
                  local_608 = *(undefined1 (*) [16])((pcVar1->data)._M_elems + 8);
                  local_5f8._0_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 0xc);
                  uVar9 = *(undefined8 *)((pcVar1->data)._M_elems + 0xe);
                  stack0xfffffffffffffa10 = (undefined5)uVar9;
                  uStack_5eb = (undefined3)((ulong)uVar9 >> 0x28);
                  fStack_5e8 = *(fpclass_type *)((long)(&(pnVar22->m_backend).data + 1) + lVar24);
                  bStack_5e4 = *(bool *)((long)(&(pnVar22->m_backend).data + 1) + lVar24 + 4);
                  local_5e0 = *(ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                                **)((long)(&(pnVar22->m_backend).data + 1) + lVar24 + 8);
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          ((cpp_dec_float<100U,_int,_void> *)local_628,pcVar19);
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
              cpp_dec_float<long_long>(&local_1c0,0,(type *)0x0);
              RVar25 = Tolerances::epsilon((this->
                                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           )._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr);
              local_358.fpclass = cpp_dec_float_finite;
              local_358.prec_elem = 0x10;
              local_358.data._M_elems[0] = 0;
              local_358.data._M_elems[1] = 0;
              local_358.data._M_elems[2] = 0;
              local_358.data._M_elems[3] = 0;
              local_358.data._M_elems[4] = 0;
              local_358.data._M_elems[5] = 0;
              local_358.data._M_elems[6] = 0;
              local_358.data._M_elems[7] = 0;
              local_358.data._M_elems[8] = 0;
              local_358.data._M_elems[9] = 0;
              local_358.data._M_elems[10] = 0;
              local_358.data._M_elems[0xb] = 0;
              local_358.data._M_elems[0xc] = 0;
              local_358.data._M_elems[0xd] = 0;
              local_358.data._M_elems._56_5_ = 0;
              local_358.data._M_elems[0xf]._1_3_ = 0;
              local_358.exp = 0;
              local_358.neg = false;
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)&local_358,RVar25);
              auVar13 = local_608;
              auVar12 = local_618;
              auVar11 = local_628;
              uStack_660 = CONCAT35(uStack_5eb,stack0xfffffffffffffa10);
              local_698._0_4_ = local_628._0_4_;
              local_698._4_4_ = local_628._4_4_;
              uStack_690._0_4_ = local_628._8_4_;
              uStack_690._4_4_ = local_628._12_4_;
              local_688._0_4_ = local_618._0_4_;
              local_688._4_4_ = local_618._4_4_;
              uStack_680._0_4_ = local_618._8_4_;
              uStack_680._4_4_ = local_618._12_4_;
              local_678._0_4_ = local_608._0_4_;
              local_678._4_4_ = local_608._4_4_;
              uStack_670._0_4_ = local_608._8_4_;
              uStack_670._4_4_ = local_608._12_4_;
              local_668._0_4_ = local_5f8[0];
              local_668._4_4_ = local_5f8[1];
              local_658 = fStack_5e8;
              local_654 = bStack_5e4;
              local_650 = local_5e0;
              local_6e8.m_backend.data._M_elems[0] = local_1c0.data._M_elems[0];
              local_6e8.m_backend.data._M_elems[1] = local_1c0.data._M_elems[1];
              local_6e8.m_backend.data._M_elems[2] = local_1c0.data._M_elems[2];
              local_6e8.m_backend.data._M_elems[3] = local_1c0.data._M_elems[3];
              local_6e8.m_backend.data._M_elems[4] = local_1c0.data._M_elems[4];
              local_6e8.m_backend.data._M_elems[5] = local_1c0.data._M_elems[5];
              local_6e8.m_backend.data._M_elems[6] = local_1c0.data._M_elems[6];
              local_6e8.m_backend.data._M_elems[7] = local_1c0.data._M_elems[7];
              local_6e8.m_backend.data._M_elems[8] = local_1c0.data._M_elems[8];
              local_6e8.m_backend.data._M_elems[9] = local_1c0.data._M_elems[9];
              local_6e8.m_backend.data._M_elems[10] = local_1c0.data._M_elems[10];
              local_6e8.m_backend.data._M_elems[0xb] = local_1c0.data._M_elems[0xb];
              local_6e8.m_backend.data._M_elems[0xc] = local_1c0.data._M_elems[0xc];
              local_6e8.m_backend.data._M_elems[0xd] = local_1c0.data._M_elems[0xd];
              local_6e8.m_backend.data._M_elems[0xe] = local_1c0.data._M_elems[0xe];
              local_6e8.m_backend.data._M_elems[0xf] = local_1c0.data._M_elems[0xf];
              local_6e8.m_backend.exp = local_1c0.exp;
              local_6e8.m_backend.neg = local_1c0.neg;
              local_6e8.m_backend.fpclass = local_1c0.fpclass;
              local_6e8.m_backend.prec_elem = local_1c0.prec_elem;
              local_628 = auVar11;
              local_618 = auVar12;
              local_608 = auVar13;
              relDiff<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                        (&local_738,(soplex *)&local_698,&local_6e8,pnVar22);
              local_7a8.data._M_elems[1] = local_738.m_backend.data._M_elems[1];
              local_7a8.data._M_elems[0] = local_738.m_backend.data._M_elems[0];
              local_7a8.data._M_elems[0xc] = local_738.m_backend.data._M_elems[0xc];
              local_7a8.data._M_elems[0xd] = local_738.m_backend.data._M_elems[0xd];
              local_7a8.data._M_elems[0xe] = local_738.m_backend.data._M_elems[0xe];
              local_7a8.data._M_elems[0xf] = local_738.m_backend.data._M_elems[0xf];
              local_7a8.data._M_elems[8] = local_738.m_backend.data._M_elems[8];
              local_7a8.data._M_elems[9] = local_738.m_backend.data._M_elems[9];
              local_7a8.data._M_elems[10] = local_738.m_backend.data._M_elems[10];
              local_7a8.data._M_elems[0xb] = local_738.m_backend.data._M_elems[0xb];
              local_7a8.data._M_elems[2] = local_738.m_backend.data._M_elems[2];
              local_7a8.data._M_elems[3] = local_738.m_backend.data._M_elems[3];
              local_7a8.exp = local_738.m_backend.exp;
              local_7a8.neg = local_738.m_backend.neg;
              local_7a8.fpclass = local_738.m_backend.fpclass;
              local_7a8.prec_elem = local_738.m_backend.prec_elem;
              in_RCX = (Item *)(local_738.m_backend._72_8_ & 0xffffffff);
              if ((local_738.m_backend.neg == true) &&
                 (local_738.m_backend.data._M_elems[0] != 0 || local_738.m_backend.fpclass != 0)) {
                local_7a8.neg = false;
              }
              if (((local_738.m_backend.fpclass != 2) && (local_358.fpclass != cpp_dec_float_NaN))
                 && (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                              compare(&local_7a8,&local_358), iVar17 < 1)) {
                DIdxSet::addIdx(&local_7c8,(int)lVar20);
              }
            }
            lVar20 = lVar20 + 1;
            lVar24 = lVar24 + 0x50;
          } while (lVar20 < (this->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .set.thenum);
        }
        do {
          lVar24 = (long)local_7c8.super_IdxSet.num;
          if ((lVar24 < 1) || (bVar14)) {
            iVar17 = 0;
          }
          else {
            iVar17 = 0;
            do {
              local_7d0 = (DataKey)id(this,local_7c8.super_IdxSet.idx[lVar24 + -1]);
              bVar15 = enter(this,(SPxId *)&local_7d0,true);
              (*(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x88])(this);
              if (bVar15) {
                iVar17 = iVar17 + 1;
                lVar20 = (long)local_7c8.super_IdxSet.num;
                local_7c8.super_IdxSet.num = local_7c8.super_IdxSet.num + -1;
                in_RCX = (Item *)(ulong)(uint)local_7c8.super_IdxSet.idx[lVar20 + -1];
                local_7c8.super_IdxSet.idx[lVar24 + -1] = local_7c8.super_IdxSet.idx[lVar20 + -1];
                if ((-1 < this->maxIters) &&
                   (this->maxIters <=
                    (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).iterCount)) {
                  bVar14 = true;
                }
              }
              bVar15 = isTimeLimitReached(this,false);
              if (bVar15) {
                bVar14 = true;
              }
            } while ((1 < lVar24) && (lVar24 = lVar24 + -1, !bVar14));
          }
          if (iVar17 == 0) {
            bVar14 = true;
          }
          this->polishCount = this->polishCount + iVar17;
        } while (!bVar14);
      }
    }
    else {
      local_638 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                   *)&(this->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.colstat.data;
      setType(this,LEAVE);
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x76])(this);
      leavetol((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_7a8,this);
      local_568[0xc] = local_7a8.data._M_elems[0xc];
      local_568[0xd] = local_7a8.data._M_elems[0xd];
      local_568[0xe] = local_7a8.data._M_elems[0xe];
      local_568[0xf] = local_7a8.data._M_elems[0xf];
      local_568[8] = local_7a8.data._M_elems[8];
      local_568[9] = local_7a8.data._M_elems[9];
      local_568[10] = local_7a8.data._M_elems[10];
      local_568[0xb] = local_7a8.data._M_elems[0xb];
      local_568[4] = local_7a8.data._M_elems[4];
      local_568[5] = local_7a8.data._M_elems[5];
      local_568[6] = local_7a8.data._M_elems[6];
      local_568[7] = local_7a8.data._M_elems[7];
      local_568[0] = local_7a8.data._M_elems[0];
      local_568[1] = local_7a8.data._M_elems[1];
      local_568[2] = local_7a8.data._M_elems[2];
      local_568[3] = local_7a8.data._M_elems[3];
      local_73c = local_7a8.exp;
      local_7d1 = local_7a8.neg;
      local_518._0_4_ = local_7a8.fpclass;
      local_518._4_4_ = local_7a8.prec_elem;
      uStack_510 = 0;
      this->instableLeave = false;
      (*this->theratiotester->_vptr_SPxRatioTester[9])
                (this->theratiotester,(ulong)(uint)this->theType);
      local_748 = (Status *)
                  CONCAT44(local_748._4_4_,
                           (this->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .
                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .set.thenum);
      iVar17 = (this->integerVariables).thesize;
      local_750 = (Status *)CONCAT44(local_750._4_4_,iVar17);
      if (this->polishObj == POLISH_INTEGRALITY) {
        DIdxSet::DIdxSet(&local_7c8,(this->thecovectors->set).thenum);
        if (0 < (this->thecovectors->set).thenum) {
          local_758 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                       *)&(this->
                          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).thedesc.rowstat.data;
          local_520 = &(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set;
          lVar24 = 9;
          lVar20 = 0;
          do {
            local_7d0 = (this->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).theBaseId.data[lVar20].super_DataKey;
            if (local_7d0.info < 0) {
              iVar18 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::number(&this->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ,(SPxId *)&local_7d0);
              pCVar21 = local_758;
LAB_003c8dba:
              in_RCX = pCVar21->theitem;
              if (((((cpp_dec_float<100U,_int,_void> *)&in_RCX->data)->data)._M_elems[iVar18] &
                  0xfffffffd) == 0xfffffffc) {
                pnVar7 = (this->theFvec->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar2 = (pnVar7->m_backend).data._M_elems + lVar24 * 2U + 0xffffffffffffffee;
                local_4c8 = *(uint (*) [2])puVar2;
                auStack_4c0 = *(uint (*) [2])(puVar2 + 2);
                puVar2 = (pnVar7->m_backend).data._M_elems + lVar24 * 2U + 0xfffffffffffffff2;
                local_4b8 = *(uint (*) [2])puVar2;
                auStack_4b0 = *(uint (*) [2])(puVar2 + 2);
                puVar2 = (pnVar7->m_backend).data._M_elems + lVar24 * 2U + 0xfffffffffffffff6;
                local_4a8 = *(uint (*) [2])puVar2;
                auStack_4a0 = *(uint (*) [2])(puVar2 + 2);
                puVar2 = (pnVar7->m_backend).data._M_elems + lVar24 * 2U + 0xfffffffffffffffa;
                local_498 = *(uint (*) [2])puVar2;
                uStack_490 = *(undefined8 *)(puVar2 + 2);
                fVar4 = (pnVar7->m_backend).data._M_elems[lVar24 * 2U + 0xfffffffffffffffe];
                iVar10 = (pnVar7->m_backend).data._M_elems[lVar24 * 2U + 0xffffffffffffffff];
                local_648 = *(ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                              **)((pnVar7->m_backend).data._M_elems + lVar24 * 2);
                uStack_640 = 0;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                cpp_dec_float<long_long>(&local_210,0,(type *)0x0);
                RVar25 = Tolerances::epsilon((this->
                                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             )._tolerances.
                                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr);
                local_3a8.fpclass = cpp_dec_float_finite;
                local_3a8.prec_elem = 0x10;
                local_3a8.data._M_elems[0] = 0;
                local_3a8.data._M_elems[1] = 0;
                local_3a8.data._M_elems[2] = 0;
                local_3a8.data._M_elems[3] = 0;
                local_3a8.data._M_elems[4] = 0;
                local_3a8.data._M_elems[5] = 0;
                local_3a8.data._M_elems[6] = 0;
                local_3a8.data._M_elems[7] = 0;
                local_3a8.data._M_elems[8] = 0;
                local_3a8.data._M_elems[9] = 0;
                local_3a8.data._M_elems[10] = 0;
                local_3a8.data._M_elems[0xb] = 0;
                local_3a8.data._M_elems[0xc] = 0;
                local_3a8.data._M_elems[0xd] = 0;
                local_3a8.data._M_elems._56_5_ = 0;
                local_3a8.data._M_elems[0xf]._1_3_ = 0;
                local_3a8.exp = 0;
                local_3a8.neg = false;
                boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                          ((cpp_dec_float<100u,int,void> *)&local_3a8,RVar25);
                local_698._0_4_ = local_4c8[0];
                local_698._4_4_ = local_4c8[1];
                uStack_690._0_4_ = auStack_4c0[0];
                uStack_690._4_4_ = auStack_4c0[1];
                local_688._0_4_ = local_4b8[0];
                local_688._4_4_ = local_4b8[1];
                uStack_680._0_4_ = auStack_4b0[0];
                uStack_680._4_4_ = auStack_4b0[1];
                local_678._0_4_ = local_4a8[0];
                local_678._4_4_ = local_4a8[1];
                uStack_670._0_4_ = auStack_4a0[0];
                uStack_670._4_4_ = auStack_4a0[1];
                local_668._0_4_ = local_498[0];
                local_668._4_4_ = local_498[1];
                uStack_660 = uStack_490;
                local_650 = local_648;
                local_6e8.m_backend.data._M_elems[0] = local_210.data._M_elems[0];
                local_6e8.m_backend.data._M_elems[1] = local_210.data._M_elems[1];
                local_6e8.m_backend.data._M_elems[2] = local_210.data._M_elems[2];
                local_6e8.m_backend.data._M_elems[3] = local_210.data._M_elems[3];
                local_6e8.m_backend.data._M_elems[4] = local_210.data._M_elems[4];
                local_6e8.m_backend.data._M_elems[5] = local_210.data._M_elems[5];
                local_6e8.m_backend.data._M_elems[6] = local_210.data._M_elems[6];
                local_6e8.m_backend.data._M_elems[7] = local_210.data._M_elems[7];
                local_6e8.m_backend.data._M_elems[8] = local_210.data._M_elems[8];
                local_6e8.m_backend.data._M_elems[9] = local_210.data._M_elems[9];
                local_6e8.m_backend.data._M_elems[10] = local_210.data._M_elems[10];
                local_6e8.m_backend.data._M_elems[0xb] = local_210.data._M_elems[0xb];
                local_6e8.m_backend.data._M_elems[0xc] = local_210.data._M_elems[0xc];
                local_6e8.m_backend.data._M_elems[0xd] = local_210.data._M_elems[0xd];
                local_6e8.m_backend.data._M_elems[0xe] = local_210.data._M_elems[0xe];
                local_6e8.m_backend.data._M_elems[0xf] = local_210.data._M_elems[0xf];
                local_6e8.m_backend.exp = local_210.exp;
                local_6e8.m_backend.neg = local_210.neg;
                local_6e8.m_backend.fpclass = local_210.fpclass;
                local_6e8.m_backend.prec_elem = local_210.prec_elem;
                local_658 = fVar4;
                local_654 = (byte)iVar10;
                relDiff<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                          (&local_738,(soplex *)&local_698,&local_6e8,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_RCX);
                local_7a8.data._M_elems[1] = local_738.m_backend.data._M_elems[1];
                local_7a8.data._M_elems[0] = local_738.m_backend.data._M_elems[0];
                local_7a8.data._M_elems[0xc] = local_738.m_backend.data._M_elems[0xc];
                local_7a8.data._M_elems[0xd] = local_738.m_backend.data._M_elems[0xd];
                local_7a8.data._M_elems[0xe] = local_738.m_backend.data._M_elems[0xe];
                local_7a8.data._M_elems[0xf] = local_738.m_backend.data._M_elems[0xf];
                local_7a8.data._M_elems[8] = local_738.m_backend.data._M_elems[8];
                local_7a8.data._M_elems[9] = local_738.m_backend.data._M_elems[9];
                local_7a8.data._M_elems[10] = local_738.m_backend.data._M_elems[10];
                local_7a8.data._M_elems[0xb] = local_738.m_backend.data._M_elems[0xb];
                local_7a8.data._M_elems[2] = local_738.m_backend.data._M_elems[2];
                local_7a8.data._M_elems[3] = local_738.m_backend.data._M_elems[3];
                local_7a8.exp = local_738.m_backend.exp;
                local_7a8.neg = local_738.m_backend.neg;
                local_7a8.fpclass = local_738.m_backend.fpclass;
                local_7a8.prec_elem = local_738.m_backend.prec_elem;
                in_RCX = (Item *)(local_738.m_backend._72_8_ & 0xffffffff);
                if ((local_738.m_backend.neg == true) &&
                   (local_738.m_backend.data._M_elems[0] != 0 || local_738.m_backend.fpclass != 0))
                {
                  local_7a8.neg = false;
                }
                if ((local_738.m_backend.fpclass == 2) || (local_3a8.fpclass == cpp_dec_float_NaN))
                {
                  iVar17 = (int)local_750;
                }
                else {
                  iVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (&local_7a8,&local_3a8);
                  iVar17 = (int)local_750;
                  if (iVar18 < 1) {
                    DIdxSet::addIdx(&local_7c8,(int)lVar20);
                  }
                }
              }
            }
            else if (iVar17 == (int)local_748) {
              SPxColId::SPxColId((SPxColId *)&local_7a8,(SPxId *)&local_7d0);
              iVar18 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                       ::number(local_520,(DataKey *)&local_7a8);
              in_RCX = (Item *)(this->integerVariables).data;
              if ((((cpp_dec_float<100U,_int,_void> *)&in_RCX->data)->data)._M_elems[iVar18] != 1) {
                iVar18 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::number(&this->
                                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ,(SPxId *)&local_7d0);
                pCVar21 = local_638;
                goto LAB_003c8dba;
              }
            }
            lVar20 = lVar20 + 1;
            lVar24 = lVar24 + 10;
          } while (lVar20 < (this->thecovectors->set).thenum);
        }
        do {
          lVar24 = (long)local_7c8.super_IdxSet.num;
          if ((lVar24 < 1) || (bVar14)) {
            iVar17 = 0;
          }
          else {
            iVar17 = 0;
            do {
              bVar15 = leave(this,local_7c8.super_IdxSet.idx[lVar24 + -1],true);
              (*(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x88])(this);
              if (bVar15) {
                iVar17 = iVar17 + 1;
                lVar20 = (long)local_7c8.super_IdxSet.num;
                local_7c8.super_IdxSet.num = local_7c8.super_IdxSet.num + -1;
                in_RCX = (Item *)(ulong)(uint)local_7c8.super_IdxSet.idx[lVar20 + -1];
                local_7c8.super_IdxSet.idx[lVar24 + -1] = local_7c8.super_IdxSet.idx[lVar20 + -1];
                if ((-1 < this->maxIters) &&
                   (this->maxIters <=
                    (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).iterCount)) {
                  bVar14 = true;
                }
              }
              bVar15 = isTimeLimitReached(this,false);
              if (bVar15) {
                bVar14 = true;
              }
            } while ((1 < lVar24) && (lVar24 = lVar24 + -1, !bVar14));
          }
          if (iVar17 == 0) {
            bVar14 = true;
          }
          this->polishCount = this->polishCount + iVar17;
        } while (!bVar14);
      }
      else {
        DIdxSet::DIdxSet(&local_7c8,(this->thecovectors->set).thenum);
        if (0 < (this->thecovectors->set).thenum) {
          local_758 = &(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set;
          lVar24 = 0x24;
          lVar20 = 0;
          do {
            local_7d0 = (this->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).theBaseId.data[lVar20].super_DataKey;
            if (-1 < local_7d0.info) {
              if (iVar17 == (int)local_748) {
                SPxColId::SPxColId((SPxColId *)&local_7a8,(SPxId *)&local_7d0);
                iVar18 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                         ::number(local_758,(DataKey *)&local_7a8);
                in_RCX = (Item *)(this->integerVariables).data;
                if ((((cpp_dec_float<100U,_int,_void> *)&in_RCX->data)->data)._M_elems[iVar18] == 0)
                goto LAB_003c98c5;
              }
              if ((*(uint *)((long)&(local_638->theitem->data).
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem + lVar20 * 4) & 0xfffffffd) == 0xfffffffc) {
                pnVar7 = (this->theFvec->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar2 = (uint *)((long)(pnVar7->m_backend).data._M_elems + lVar24 * 2 + -0x48);
                local_508 = *(uint (*) [2])puVar2;
                auStack_500 = *(uint (*) [2])(puVar2 + 2);
                puVar2 = (uint *)((long)(pnVar7->m_backend).data._M_elems + lVar24 * 2 + -0x38);
                local_4f8 = *(uint (*) [2])puVar2;
                auStack_4f0 = *(uint (*) [2])(puVar2 + 2);
                puVar2 = (uint *)((long)(pnVar7->m_backend).data._M_elems + lVar24 * 2 + -0x28);
                local_4e8 = *(uint (*) [2])puVar2;
                auStack_4e0 = *(uint (*) [2])(puVar2 + 2);
                puVar2 = (uint *)((long)(pnVar7->m_backend).data._M_elems + lVar24 * 2 + -0x18);
                local_4d8 = *(uint (*) [2])puVar2;
                uStack_4d0 = *(undefined8 *)(puVar2 + 2);
                fVar4 = *(fpclass_type *)((long)(pnVar7->m_backend).data._M_elems + lVar24 * 2 + -8)
                ;
                bVar3 = *(byte *)((long)(pnVar7->m_backend).data._M_elems + lVar24 * 2 + -4);
                local_648 = *(ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                              **)((long)(pnVar7->m_backend).data._M_elems + lVar24 * 2);
                uStack_640 = 0;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                cpp_dec_float<long_long>(&local_260,0,(type *)0x0);
                RVar25 = Tolerances::epsilon((this->
                                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             )._tolerances.
                                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr);
                local_3f8.fpclass = cpp_dec_float_finite;
                local_3f8.prec_elem = 0x10;
                local_3f8.data._M_elems[0] = 0;
                local_3f8.data._M_elems[1] = 0;
                local_3f8.data._M_elems[2] = 0;
                local_3f8.data._M_elems[3] = 0;
                local_3f8.data._M_elems[4] = 0;
                local_3f8.data._M_elems[5] = 0;
                local_3f8.data._M_elems[6] = 0;
                local_3f8.data._M_elems[7] = 0;
                local_3f8.data._M_elems[8] = 0;
                local_3f8.data._M_elems[9] = 0;
                local_3f8.data._M_elems[10] = 0;
                local_3f8.data._M_elems[0xb] = 0;
                local_3f8.data._M_elems[0xc] = 0;
                local_3f8.data._M_elems[0xd] = 0;
                local_3f8.data._M_elems._56_5_ = 0;
                local_3f8.data._M_elems[0xf]._1_3_ = 0;
                local_3f8.exp = 0;
                local_3f8.neg = false;
                boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                          ((cpp_dec_float<100u,int,void> *)&local_3f8,RVar25);
                local_698._0_4_ = local_508[0];
                local_698._4_4_ = local_508[1];
                uStack_690._0_4_ = auStack_500[0];
                uStack_690._4_4_ = auStack_500[1];
                local_688._0_4_ = local_4f8[0];
                local_688._4_4_ = local_4f8[1];
                uStack_680._0_4_ = auStack_4f0[0];
                uStack_680._4_4_ = auStack_4f0[1];
                local_678._0_4_ = local_4e8[0];
                local_678._4_4_ = local_4e8[1];
                uStack_670._0_4_ = auStack_4e0[0];
                uStack_670._4_4_ = auStack_4e0[1];
                local_668._0_4_ = local_4d8[0];
                local_668._4_4_ = local_4d8[1];
                uStack_660 = uStack_4d0;
                local_650 = local_648;
                local_6e8.m_backend.data._M_elems[0] = local_260.data._M_elems[0];
                local_6e8.m_backend.data._M_elems[1] = local_260.data._M_elems[1];
                local_6e8.m_backend.data._M_elems[2] = local_260.data._M_elems[2];
                local_6e8.m_backend.data._M_elems[3] = local_260.data._M_elems[3];
                local_6e8.m_backend.data._M_elems[4] = local_260.data._M_elems[4];
                local_6e8.m_backend.data._M_elems[5] = local_260.data._M_elems[5];
                local_6e8.m_backend.data._M_elems[6] = local_260.data._M_elems[6];
                local_6e8.m_backend.data._M_elems[7] = local_260.data._M_elems[7];
                local_6e8.m_backend.data._M_elems[8] = local_260.data._M_elems[8];
                local_6e8.m_backend.data._M_elems[9] = local_260.data._M_elems[9];
                local_6e8.m_backend.data._M_elems[10] = local_260.data._M_elems[10];
                local_6e8.m_backend.data._M_elems[0xb] = local_260.data._M_elems[0xb];
                local_6e8.m_backend.data._M_elems[0xc] = local_260.data._M_elems[0xc];
                local_6e8.m_backend.data._M_elems[0xd] = local_260.data._M_elems[0xd];
                local_6e8.m_backend.data._M_elems[0xe] = local_260.data._M_elems[0xe];
                local_6e8.m_backend.data._M_elems[0xf] = local_260.data._M_elems[0xf];
                local_6e8.m_backend.exp = local_260.exp;
                local_6e8.m_backend.neg = local_260.neg;
                local_6e8.m_backend.fpclass = local_260.fpclass;
                local_6e8.m_backend.prec_elem = local_260.prec_elem;
                local_658 = fVar4;
                local_654 = bVar3;
                relDiff<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                          (&local_738,(soplex *)&local_698,&local_6e8,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_RCX);
                local_7a8.data._M_elems[1] = local_738.m_backend.data._M_elems[1];
                local_7a8.data._M_elems[0] = local_738.m_backend.data._M_elems[0];
                local_7a8.data._M_elems[0xc] = local_738.m_backend.data._M_elems[0xc];
                local_7a8.data._M_elems[0xd] = local_738.m_backend.data._M_elems[0xd];
                local_7a8.data._M_elems[0xe] = local_738.m_backend.data._M_elems[0xe];
                local_7a8.data._M_elems[0xf] = local_738.m_backend.data._M_elems[0xf];
                local_7a8.data._M_elems[8] = local_738.m_backend.data._M_elems[8];
                local_7a8.data._M_elems[9] = local_738.m_backend.data._M_elems[9];
                local_7a8.data._M_elems[10] = local_738.m_backend.data._M_elems[10];
                local_7a8.data._M_elems[0xb] = local_738.m_backend.data._M_elems[0xb];
                local_7a8.data._M_elems[2] = local_738.m_backend.data._M_elems[2];
                local_7a8.data._M_elems[3] = local_738.m_backend.data._M_elems[3];
                local_7a8.exp = local_738.m_backend.exp;
                local_7a8.neg = local_738.m_backend.neg;
                local_7a8.fpclass = local_738.m_backend.fpclass;
                local_7a8.prec_elem = local_738.m_backend.prec_elem;
                in_RCX = (Item *)(local_738.m_backend._72_8_ & 0xffffffff);
                if ((local_738.m_backend.neg == true) &&
                   (local_738.m_backend.data._M_elems[0] != 0 || local_738.m_backend.fpclass != 0))
                {
                  local_7a8.neg = false;
                }
                if ((local_738.m_backend.fpclass == 2) || (local_3f8.fpclass == cpp_dec_float_NaN))
                {
                  iVar17 = (int)local_750;
                }
                else {
                  iVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (&local_7a8,&local_3f8);
                  iVar17 = (int)local_750;
                  if (iVar18 < 1) {
                    DIdxSet::addIdx(&local_7c8,(int)lVar20);
                  }
                }
              }
            }
LAB_003c98c5:
            lVar20 = lVar20 + 1;
            lVar24 = lVar24 + 0x28;
          } while (lVar20 < (this->thecovectors->set).thenum);
        }
        do {
          lVar24 = (long)local_7c8.super_IdxSet.num;
          if ((lVar24 < 1) || (bVar14)) {
            iVar17 = 0;
          }
          else {
            iVar17 = 0;
            do {
              bVar15 = leave(this,local_7c8.super_IdxSet.idx[lVar24 + -1],true);
              (*(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x88])(this);
              if (bVar15) {
                iVar17 = iVar17 + 1;
                lVar20 = (long)local_7c8.super_IdxSet.num;
                local_7c8.super_IdxSet.num = local_7c8.super_IdxSet.num + -1;
                in_RCX = (Item *)(ulong)(uint)local_7c8.super_IdxSet.idx[lVar20 + -1];
                local_7c8.super_IdxSet.idx[lVar24 + -1] = local_7c8.super_IdxSet.idx[lVar20 + -1];
                if ((-1 < this->maxIters) &&
                   (this->maxIters <=
                    (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).iterCount)) {
                  bVar14 = true;
                }
              }
              bVar15 = isTimeLimitReached(this,false);
              if (bVar15) {
                bVar14 = true;
              }
            } while ((1 < lVar24) && (lVar24 = lVar24 + -1, !bVar14));
          }
          if (iVar17 == 0) {
            bVar14 = true;
          }
          this->polishCount = this->polishCount + iVar17;
        } while (!bVar14);
      }
    }
    DIdxSet::~DIdxSet(&local_7c8);
    iVar17 = local_73c;
    pSVar5 = this->spxout;
    if ((pSVar5 != (SPxOut *)0x0) && (2 < (int)pSVar5->m_verbosity)) {
      local_7a8.data._M_elems[0] = pSVar5->m_verbosity;
      local_738.m_backend.data._M_elems[0] = 3;
      (*pSVar5->_vptr_SPxOut[2])();
      pSVar5 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar5->m_streams[pSVar5->m_verbosity]," --- finished solution polishing (",0x22);
      std::ostream::operator<<((ostream *)pSVar5->m_streams[pSVar5->m_verbosity],this->polishCount);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar5->m_streams[pSVar5->m_verbosity]," pivots)",8);
      in_RCX = (Item *)pSVar5->m_streams;
      plVar6 = *(long **)((((cpp_dec_float<100U,_int,_void> *)&in_RCX->data)->data)._M_elems +
                         (ulong)pSVar5->m_verbosity * 2);
      cVar8 = (char)plVar6;
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + cVar8);
      std::ostream::put(cVar8);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_7a8);
    }
    if ((this->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thestatus != OPTIMAL) {
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thestatus = OPTIMAL;
    }
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x5e])(&local_80,this);
    local_6e8.m_backend.data._M_elems[0xc] = local_a0[0];
    local_6e8.m_backend.data._M_elems[0xd] = local_a0[1];
    local_6e8.m_backend.data._M_elems[0xe] = auStack_98[0];
    local_6e8.m_backend.data._M_elems[0xf] = auStack_98[1];
    local_6e8.m_backend.data._M_elems[8] = local_b0[0];
    local_6e8.m_backend.data._M_elems[9] = local_b0[1];
    local_6e8.m_backend.data._M_elems[10] = auStack_a8[0];
    local_6e8.m_backend.data._M_elems[0xb] = auStack_a8[1];
    local_6e8.m_backend.data._M_elems[4] = local_c0[0];
    local_6e8.m_backend.data._M_elems[5] = local_c0[1];
    local_6e8.m_backend.data._M_elems[6] = auStack_b8[0];
    local_6e8.m_backend.data._M_elems[7] = auStack_b8[1];
    local_6e8.m_backend.data._M_elems[0] = local_d0[0];
    local_6e8.m_backend.data._M_elems[1] = local_d0[1];
    local_6e8.m_backend.data._M_elems[2] = auStack_c8[0];
    local_6e8.m_backend.data._M_elems[3] = auStack_c8[1];
    local_448.data._M_elems[0] = local_568[0];
    local_448.data._M_elems[1] = local_568[1];
    local_448.data._M_elems[2] = local_568[2];
    local_448.data._M_elems[3] = local_568[3];
    local_448.data._M_elems[4] = local_568[4];
    local_448.data._M_elems[5] = local_568[5];
    local_448.data._M_elems[6] = local_568[6];
    local_448.data._M_elems[7] = local_568[7];
    local_448.data._M_elems[8] = local_568[8];
    local_448.data._M_elems[9] = local_568[9];
    local_448.data._M_elems[10] = local_568[10];
    local_448.data._M_elems[0xb] = local_568[0xb];
    local_448.data._M_elems[0xc] = local_568[0xc];
    local_448.data._M_elems[0xd] = local_568[0xd];
    local_448.data._M_elems[0xe] = local_568[0xe];
    local_448.data._M_elems[0xf] = local_568[0xf];
    local_448.exp = iVar17;
    local_448.neg = (bool)local_7d1;
    local_448.fpclass = (undefined4)local_518;
    local_448.prec_elem = local_518._4_4_;
    local_698 = local_80;
    uStack_690 = uStack_78;
    local_688 = local_70;
    uStack_680 = uStack_68;
    local_678 = local_60;
    uStack_670 = uStack_58;
    local_668 = local_50;
    uStack_660 = uStack_48;
    local_658 = local_40;
    local_654 = local_3c;
    local_650 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                 *)local_38;
    local_6e8.m_backend.exp = local_90;
    local_6e8.m_backend.neg = (bool)local_8c;
    local_6e8.m_backend.fpclass = local_88;
    local_6e8.m_backend.prec_elem = iStack_84;
    relDiff<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
              (&local_738,(soplex *)&local_698,&local_6e8,
               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)CONCAT71((int7)((ulong)in_RCX >> 8),local_8c));
    local_7a8.data._M_elems[1] = local_738.m_backend.data._M_elems[1];
    local_7a8.data._M_elems[0] = local_738.m_backend.data._M_elems[0];
    local_7a8.data._M_elems[2] = local_738.m_backend.data._M_elems[2];
    local_7a8.data._M_elems[3] = local_738.m_backend.data._M_elems[3];
    local_7a8.data._M_elems[8] = local_738.m_backend.data._M_elems[8];
    local_7a8.data._M_elems[9] = local_738.m_backend.data._M_elems[9];
    local_7a8.data._M_elems[10] = local_738.m_backend.data._M_elems[10];
    local_7a8.data._M_elems[0xb] = local_738.m_backend.data._M_elems[0xb];
    local_7a8.data._M_elems[0xc] = local_738.m_backend.data._M_elems[0xc];
    local_7a8.data._M_elems[0xd] = local_738.m_backend.data._M_elems[0xd];
    local_7a8.data._M_elems[0xe] = local_738.m_backend.data._M_elems[0xe];
    local_7a8.data._M_elems[0xf] = local_738.m_backend.data._M_elems[0xf];
    local_7a8.exp = local_738.m_backend.exp;
    local_7a8.neg = local_738.m_backend.neg;
    local_7a8.fpclass = local_738.m_backend.fpclass;
    local_7a8.prec_elem = local_738.m_backend.prec_elem;
    if ((local_738.m_backend.neg == true) &&
       (local_738.m_backend.data._M_elems[0] != 0 || local_738.m_backend.fpclass != 0)) {
      local_7a8.neg = false;
    }
    bVar14 = true;
    if ((local_738.m_backend.fpclass != 2) && (local_448.fpclass != cpp_dec_float_NaN)) {
      iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&local_7a8,&local_448);
      bVar14 = 0 < iVar17;
    }
  }
  return bVar14;
}

Assistant:

bool SPxSolverBase<R>::performSolutionPolishing()
{
   // catch rare case that the iteration limit is exactly reached at optimality
   bool stop = (maxIters >= 0 && iterations() >= maxIters && !isTimeLimitReached());

   // only polish an already optimal basis
   if(stop || polishObj == POLISH_OFF || status() != OPTIMAL)
      return false;

   int nSuccessfulPivots;
   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   const typename SPxBasisBase<R>::Desc::Status* rowstatus = ds.rowStatus();
   const typename SPxBasisBase<R>::Desc::Status* colstatus = ds.colStatus();
   typename SPxBasisBase<R>::Desc::Status stat;
   SPxId polishId;
   bool success = false;

   R alloweddeviation;
   R origval = value();

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- perform solution polishing" << std::endl;)

   if(rep() == COLUMN)
   {
      setType(ENTER); // use primal simplex to preserve feasibility
      init();
      alloweddeviation = entertol();

      instableEnter = false;
      theratiotester->setType(type());

      int nrows = this->nRows();
      int ncols = this->nCols();

      assert(nrows >= 0);
      assert(ncols >= 0);

      if(polishObj == POLISH_INTEGRALITY)
      {
         DIdxSet slackcandidates(nrows);
         DIdxSet continuousvars(ncols);

         // collect nonbasic slack variables that could be made basic
         for(int i = 0; i < nrows; ++i)
         {
            // only check nonbasic rows, skip equations
            if(rowstatus[i] ==  SPxBasisBase<R>::Desc::P_ON_LOWER
                  || rowstatus[i] == SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               // only consider rows with zero dual multiplier to preserve optimality
               if(EQrel((*theCoPvec)[i], (R) 0, this->epsilon()))
                  slackcandidates.addIdx(i);
            }
         }

         // collect continuous variables that could be made basic
         if(integerVariables.size() == ncols)
         {
            for(int i = 0; i < ncols; ++i)
            {
               // skip fixed variables
               if(colstatus[i] == SPxBasisBase<R>::Desc::P_ON_LOWER
                     || colstatus[i] ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
               {
                  // only consider continuous variables with zero dual multiplier to preserve optimality
                  if(EQrel(this->maxObj(i) - (*thePvec)[i], (R) 0, this->epsilon()) && integerVariables[i] == 0)
                     continuousvars.addIdx(i);
               }
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            // identify nonbasic slack variables, i.e. rows, that may be moved into the basis
            for(int i = slackcandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               polishId = coId(slackcandidates.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, rowstatus[slackcandidates.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  slackcandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // identify nonbasic variables that may be moved into the basis
            for(int i = continuousvars.size() - 1; i >= 0 && !stop; --i)
            {
               polishId = id(continuousvars.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, colstatus[continuousvars.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  continuousvars.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
      else
      {
         assert(polishObj == POLISH_FRACTIONALITY);
         assert(dim() >= 0);
         DIdxSet candidates(dim());

         // identify nonbasic variables, i.e. columns, that may be moved into the basis
         for(int i = 0; i < this->nCols() && !stop; ++i)
         {
            if(colstatus[i] == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || colstatus[i] == SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               // only consider variables with zero reduced costs to preserve optimality
               if(EQrel(this->maxObj(i) - (*thePvec)[i], (R) 0, this->epsilon()))
                  candidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = candidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               polishId = id(candidates.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, colstatus[candidates.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  candidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
   }
   else
   {
      setType(LEAVE); // use primal simplex to preserve feasibility
      init();
      alloweddeviation = leavetol();
      instableLeave = false;
      theratiotester->setType(type());
      bool useIntegrality = false;
      int ncols = this->nCols();

      if(integerVariables.size() == ncols)
         useIntegrality = true;

      // in ROW rep: pivot slack out of the basis
      if(polishObj == POLISH_INTEGRALITY)
      {
         assert(dim() >= 0);
         DIdxSet basiccandidates(dim());

         // collect basic candidates that may be moved out of the basis
         for(int i = 0; i < dim(); ++i)
         {
            polishId = this->baseId(i);

            if(polishId.isSPxRowId())
               stat = ds.rowStatus(this->number(polishId));
            else
            {
               // skip (integer) variables
               if(!useIntegrality || integerVariables[this->number(SPxColId(polishId))] == 1)
                  continue;

               stat = ds.colStatus(this->number(polishId));
            }

            if(stat == SPxBasisBase<R>::Desc::P_ON_LOWER || stat ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               if(EQrel((*theFvec)[i], (R) 0, this->epsilon()))
                  basiccandidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = basiccandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               SPxOut::debug(this, "try pivoting: {}", this->baseId(basiccandidates.index(i)));
               success = leave(basiccandidates.index(i), true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  basiccandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
      else
      {
         assert(polishObj == POLISH_FRACTIONALITY);
         assert(dim() >= 0);
         DIdxSet basiccandidates(dim());

         // collect basic (integer) variables, that may be moved out of the basis
         for(int i = 0; i < dim(); ++i)
         {
            polishId = this->baseId(i);

            if(polishId.isSPxRowId())
               continue;
            else
            {
               if(useIntegrality && integerVariables[this->number(SPxColId(polishId))] == 0)
                  continue;

               stat = ds.colStatus(i);
            }

            if(stat == SPxBasisBase<R>::Desc::P_ON_LOWER || stat ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               if(EQrel((*theFvec)[i], (R) 0, this->epsilon()))
                  basiccandidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = basiccandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               SPxOut::debug(this, "try pivoting: {}", this->baseId(basiccandidates.index(i)));
               success = leave(basiccandidates.index(i), true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  basiccandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
   }

   SPX_MSG_INFO1((*this->spxout),
                 (*this->spxout) << " --- finished solution polishing (" << polishCount << " pivots)" << std::endl;)

   this->setStatus(SPxBasisBase<R>::OPTIMAL);

   // if the value() changed significantly (due to numerics) reoptimize after polishing
   if(!EQrel(value(), origval, alloweddeviation))
      return true;
   else
      return false;
}